

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionEvaluator.cpp
# Opt level: O0

bool __thiscall
OpenMD::SelectionEvaluator::loadScriptString(SelectionEvaluator *this,string *script)

{
  bool bVar1;
  string *in_stack_00000028;
  string *in_stack_00000030;
  SelectionEvaluator *in_stack_00000038;
  allocator<char> local_31;
  allocator<char> *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  
  clearState((SelectionEvaluator *)0x27201d);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  bVar1 = loadScript(in_stack_00000038,in_stack_00000030,in_stack_00000028);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
  std::allocator<char>::~allocator(&local_31);
  return bVar1;
}

Assistant:

bool SelectionEvaluator::loadScriptString(const std::string& script) {
    clearState();
    return loadScript("", script);
  }